

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O1

void __thiscall QWizard::setButtonText(QWizard *this,WizardButton which,QString *text)

{
  QWizardPrivate *this_00;
  long lVar1;
  bool bVar2;
  QWizardPage *pQVar3;
  long in_FS_OFFSET;
  WizardButton local_44;
  QWizardPage *local_40;
  int local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWizardPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  bVar2 = QWizardPrivate::ensureButton(this_00,which);
  if (bVar2) {
    local_40 = (QWizardPage *)CONCAT44(local_40._4_4_,which);
    QMap<int,_QString>::insert(&this_00->buttonCustomTexts,(int *)&local_40,text);
    lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
    local_34 = *(int *)(lVar1 + 0x340);
    local_40 = (QWizardPage *)0x0;
    pQVar3 = QMap<int,_QWizardPage_*>::value
                       ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&local_34,&local_40);
    if (pQVar3 != (QWizardPage *)0x0) {
      lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
      local_34 = *(int *)(lVar1 + 0x340);
      local_40 = (QWizardPage *)0x0;
      pQVar3 = QMap<int,_QWizardPage_*>::value
                         ((QMap<int,_QWizardPage_*> *)(lVar1 + 0x2e0),&local_34,&local_40);
      local_44 = which;
      bVar2 = QMap<int,_QString>::contains
                        ((QMap<int,_QString> *)(*(long *)&(pQVar3->super_QWidget).field_0x8 + 0x310)
                         ,&local_44);
      if (bVar2) goto LAB_00517d5b;
    }
    QAbstractButton::setText(*(QAbstractButton **)((long)&this_00->field_20 + (long)which * 8),text)
    ;
  }
LAB_00517d5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWizard::setButtonText(WizardButton which, const QString &text)
{
    Q_D(QWizard);

    if (!d->ensureButton(which))
        return;

    d->buttonCustomTexts.insert(which, text);

    if (!currentPage() || !currentPage()->d_func()->buttonCustomTexts.contains(which))
        d->btns[which]->setText(text);
}